

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O0

PyObject * libxml_charPtrWrap(char *str)

{
  PyObject *ret;
  char *str_local;
  
  if (str == (char *)0x0) {
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    str_local = &_Py_NoneStruct;
  }
  else {
    str_local = (char *)PyUnicode_FromString(str);
    (*_xmlFree)(str);
  }
  return (PyObject *)str_local;
}

Assistant:

PyObject *
libxml_charPtrWrap(char *str)
{
    PyObject *ret;

    if (str == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    ret = PY_IMPORT_STRING(str);
    xmlFree(str);
    return (ret);
}